

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

YamlTag_e __thiscall c4::yml::to_tag(yml *this,csubstr tag)

{
  code *pcVar1;
  bool bVar2;
  YamlTag_e YVar3;
  int iVar4;
  ro_substr pattern;
  ro_substr pattern_00;
  ro_substr pattern_01;
  ro_substr pattern_02;
  basic_substring<const_char> local_20;
  basic_substring<const_char> local_10;
  
  local_20.len = (size_t)tag.str;
  pattern.len = 2;
  pattern.str = "!<";
  local_20.str = (char *)this;
  bVar2 = basic_substring<const_char>::begins_with(&local_20,pattern);
  if (bVar2) {
    if ((char *)local_20.len == (char *)0x0) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        pcVar1 = (code *)swi(3);
        YVar3 = (*pcVar1)();
        return YVar3;
      }
      handle_error(0x1e6196,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              (&local_10,(char *)(local_20.str + 1),(size_t)(local_20.len + -1));
    local_20.str = local_10.str;
    local_20.len = local_10.len;
  }
  pattern_00.len = 2;
  pattern_00.str = "!!";
  bVar2 = basic_substring<const_char>::begins_with(&local_20,pattern_00);
  if (bVar2) {
    if (local_20.len < (char *)0x2) {
      if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        pcVar1 = (code *)swi(3);
        YVar3 = (*pcVar1)();
        return YVar3;
      }
      handle_error(0x1e6196,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x1533,"first >= 0 && first <= len");
    }
    basic_substring<const_char>::basic_substring
              (&local_10,(char *)(local_20.str + 2),(size_t)(local_20.len + -2));
  }
  else {
    if (((char *)local_20.len != (char *)0x0) && ((yml)*local_20.str == (yml)0x21)) {
      return TAG_NONE;
    }
    pattern_01.len = 0x12;
    pattern_01.str = "tag:yaml.org,2002:";
    bVar2 = basic_substring<const_char>::begins_with(&local_20,pattern_01);
    if (bVar2) {
      if (local_20.len < (char *)0x12) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          YVar3 = (*pcVar1)();
          return YVar3;
        }
        handle_error(0x1e6196,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                (&local_10,(char *)(local_20.str + 0x12),(size_t)(local_20.len + -0x12));
    }
    else {
      pattern_02.len = 0x13;
      pattern_02.str = "<tag:yaml.org,2002:";
      bVar2 = basic_substring<const_char>::begins_with(&local_20,pattern_02);
      if (!bVar2) goto LAB_001b11d6;
      if (local_20.len < (char *)0x13) {
        if ((((byte)s_error_flags & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
          pcVar1 = (code *)swi(3);
          YVar3 = (*pcVar1)();
          return YVar3;
        }
        handle_error(0x1e6196,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x1533,"first >= 0 && first <= len");
      }
      basic_substring<const_char>::basic_substring
                (&local_10,(char *)(local_20.str + 0x13),(size_t)(local_20.len + -0x13));
      local_20.str = local_10.str;
      local_20.len = local_10.len;
      if ((char *)local_10.len == (char *)0x0) {
        return TAG_NONE;
      }
      basic_substring<const_char>::basic_substring
                (&local_10,local_10.str,(size_t)(local_10.len + -1));
    }
  }
  local_20.str = local_10.str;
  local_20.len = local_10.len;
LAB_001b11d6:
  iVar4 = basic_substring<const_char>::compare(&local_20,"map",3);
  if (iVar4 == 0) {
    YVar3 = TAG_MAP;
  }
  else {
    iVar4 = basic_substring<const_char>::compare(&local_20,"omap",4);
    if (iVar4 == 0) {
      YVar3 = TAG_OMAP;
    }
    else {
      iVar4 = basic_substring<const_char>::compare(&local_20,"pairs",5);
      if (iVar4 == 0) {
        YVar3 = TAG_PAIRS;
      }
      else {
        iVar4 = basic_substring<const_char>::compare(&local_20,"set",3);
        if (iVar4 == 0) {
          YVar3 = TAG_SET;
        }
        else {
          iVar4 = basic_substring<const_char>::compare(&local_20,"seq",3);
          if (iVar4 == 0) {
            YVar3 = TAG_SEQ;
          }
          else {
            iVar4 = basic_substring<const_char>::compare(&local_20,"binary",6);
            if (iVar4 == 0) {
              YVar3 = TAG_BINARY;
            }
            else {
              iVar4 = basic_substring<const_char>::compare(&local_20,"bool",4);
              if (iVar4 == 0) {
                YVar3 = TAG_BOOL;
              }
              else {
                iVar4 = basic_substring<const_char>::compare(&local_20,"float",5);
                if (iVar4 == 0) {
                  YVar3 = TAG_FLOAT;
                }
                else {
                  iVar4 = basic_substring<const_char>::compare(&local_20,"int",3);
                  if (iVar4 == 0) {
                    YVar3 = TAG_INT;
                  }
                  else {
                    iVar4 = basic_substring<const_char>::compare(&local_20,"merge",5);
                    if (iVar4 == 0) {
                      YVar3 = TAG_MERGE;
                    }
                    else {
                      iVar4 = basic_substring<const_char>::compare(&local_20,"null",4);
                      if (iVar4 == 0) {
                        YVar3 = TAG_NULL;
                      }
                      else {
                        iVar4 = basic_substring<const_char>::compare(&local_20,"str",3);
                        if (iVar4 == 0) {
                          YVar3 = TAG_STR;
                        }
                        else {
                          iVar4 = basic_substring<const_char>::compare(&local_20,"timestamp",9);
                          if (iVar4 == 0) {
                            YVar3 = TAG_TIMESTAMP;
                          }
                          else {
                            iVar4 = basic_substring<const_char>::compare(&local_20,"value",5);
                            YVar3 = TAG_VALUE;
                            if (iVar4 != 0) {
                              YVar3 = TAG_NONE;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return YVar3;
}

Assistant:

YamlTag_e to_tag(csubstr tag)
{
    if(tag.begins_with("!<"))
        tag = tag.sub(1);
    if(tag.begins_with("!!"))
        tag = tag.sub(2);
    else if(tag.begins_with('!'))
        return TAG_NONE;
    else if(tag.begins_with("tag:yaml.org,2002:"))
    {
        RYML_ASSERT(csubstr("tag:yaml.org,2002:").len == 18);
        tag = tag.sub(18);
    }
    else if(tag.begins_with("<tag:yaml.org,2002:"))
    {
        RYML_ASSERT(csubstr("<tag:yaml.org,2002:").len == 19);
        tag = tag.sub(19);
        if(!tag.len)
            return TAG_NONE;
        tag = tag.offs(0, 1);
    }

    if(tag == "map")
        return TAG_MAP;
    else if(tag == "omap")
        return TAG_OMAP;
    else if(tag == "pairs")
        return TAG_PAIRS;
    else if(tag == "set")
        return TAG_SET;
    else if(tag == "seq")
        return TAG_SEQ;
    else if(tag == "binary")
        return TAG_BINARY;
    else if(tag == "bool")
        return TAG_BOOL;
    else if(tag == "float")
        return TAG_FLOAT;
    else if(tag == "int")
        return TAG_INT;
    else if(tag == "merge")
        return TAG_MERGE;
    else if(tag == "null")
        return TAG_NULL;
    else if(tag == "str")
        return TAG_STR;
    else if(tag == "timestamp")
        return TAG_TIMESTAMP;
    else if(tag == "value")
        return TAG_VALUE;

    return TAG_NONE;
}